

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O1

float S_GetRolloff(FRolloffInfo *rolloff,float distance,bool logarithmic)

{
  float fVar1;
  float fVar2;
  int iVar3;
  float fVar4;
  double dVar5;
  
  fVar4 = 0.0;
  if (rolloff != (FRolloffInfo *)0x0) {
    fVar1 = rolloff->MinDistance;
    if (distance <= fVar1) {
      fVar4 = 1.0;
    }
    else {
      iVar3 = rolloff->RolloffType;
      fVar2 = (rolloff->field_2).MaxDistance;
      if (iVar3 == 2) {
        fVar4 = fVar1 / (fVar2 * (distance - fVar1) + fVar1);
      }
      else {
        fVar4 = 0.0;
        if (distance < fVar2) {
          fVar4 = (fVar2 - distance) / (fVar2 - fVar1);
          if (S_SoundCurve != (BYTE *)0x0 && iVar3 == 3) {
            fVar4 = (float)S_SoundCurve[(int)((1.0 - fVar4) * (float)S_SoundCurveSize)] *
                    0.007874016;
          }
          if (logarithmic) {
            if (iVar3 == 1) {
              return fVar4;
            }
            fVar4 = exp2f(fVar4 * 3.321928);
            dVar5 = (double)fVar4 * 0.1111111111111111 + -0.1111111111111111;
          }
          else {
            if (iVar3 != 1) {
              return fVar4;
            }
            dVar5 = log10((double)fVar4 * 9.0 + 1.0);
          }
          fVar4 = (float)dVar5;
        }
      }
    }
  }
  return fVar4;
}

Assistant:

float S_GetRolloff(FRolloffInfo *rolloff, float distance, bool logarithmic)
{
	if (rolloff == NULL)
	{
		return 0;
	}

	if (distance <= rolloff->MinDistance)
	{
		return 1;
	}
	if (rolloff->RolloffType == ROLLOFF_Log)
	{ // Logarithmic rolloff has no max distance where it goes silent.
		return rolloff->MinDistance / (rolloff->MinDistance + rolloff->RolloffFactor * (distance - rolloff->MinDistance));
	}
	if (distance >= rolloff->MaxDistance)
	{
		return 0;
	}

	float volume = (rolloff->MaxDistance - distance) / (rolloff->MaxDistance - rolloff->MinDistance);
	if (rolloff->RolloffType == ROLLOFF_Custom && S_SoundCurve != NULL)
	{
		volume = S_SoundCurve[int(S_SoundCurveSize * (1 - volume))] / 127.f;
	}
	if (logarithmic)
	{
		if (rolloff->RolloffType == ROLLOFF_Linear)
		{
			return volume;
		}
		else
		{
			return float((powf(10.f, volume) - 1.) / 9.);
		}
	}
	else
	{
		if (rolloff->RolloffType == ROLLOFF_Linear)
		{
			return float(log10(9. * volume + 1.));
		}
		else
		{
			return volume;
		}
	}
}